

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  u16 *puVar1;
  ushort uVar2;
  uint iFrom;
  Pgno PVar3;
  Pager *pPager;
  PgHdr *pPg;
  u8 eType_00;
  byte bVar4;
  int iVar5;
  DbPage *p;
  undefined8 uVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  MemPage *pPtrPage;
  int local_54;
  Pgno local_50;
  undefined4 local_4c;
  MemPage *local_48;
  BtShared *local_40;
  Pgno local_34;
  
  iFrom = pDbPage->pgno;
  if (iFrom < 3) {
    uVar6 = 0x10516;
LAB_00152204:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar6,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    iVar5 = 0xb;
  }
  else {
    local_4c = (undefined4)CONCAT71(in_register_00000011,eType);
    pPager = pBt->pPager;
    pPg = pDbPage->pDbPage;
    local_50 = iPtrPage;
    local_40 = pBt;
    if ((pPager->tempFile != '\0') && (iVar5 = sqlite3PagerWrite(pPg), iVar5 != 0)) {
      return iVar5;
    }
    uVar2 = pPg->flags;
    if ((uVar2 & 2) != 0) {
      iVar5 = subjournalPageIfRequired(pPg);
      if (iVar5 != 0) {
        return iVar5;
      }
      uVar2 = pPg->flags;
    }
    local_34 = 0;
    if ((isCommit == 0) && (local_34 = 0, (uVar2 & 8) != 0)) {
      local_34 = pPg->pgno;
    }
    pPg->flags = uVar2 & 0xfff7;
    p = sqlite3PagerLookup(pPager,iFreePage);
    if (p != (DbPage *)0x0) {
      if (1 < p->nRef) {
        sqlite3PagerUnrefNotNull(p);
        uVar6 = 0xe1a2;
        goto LAB_00152204;
      }
      pPg->flags = pPg->flags | p->flags & 8;
      if (pPager->tempFile == '\0') {
        sqlite3PcacheDrop(p);
      }
      else {
        sqlite3PcacheMove(p,pPager->dbSize + 1);
      }
    }
    PVar3 = pPg->pgno;
    sqlite3PcacheMove(pPg,iFreePage);
    sqlite3PcacheMakeDirty(pPg);
    if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
      sqlite3PcacheMove(p,PVar3);
      sqlite3PagerUnrefNotNull(p);
    }
    PVar3 = local_34;
    if (local_34 != 0) {
      iVar5 = (*pPager->xGet)(pPager,local_34,(DbPage **)&local_48,0);
      if (iVar5 != 0) {
        if (pPager->dbOrigSize < PVar3) {
          return iVar5;
        }
        sqlite3BitvecClear(pPager->pInJournal,PVar3,pPager->pTmpSpace);
        return iVar5;
      }
      puVar1 = (u16 *)((long)local_48->apOvfl + 0xc);
      *puVar1 = *puVar1 | 8;
      sqlite3PcacheMakeDirty((PgHdr *)local_48);
      sqlite3PagerUnrefNotNull((DbPage *)local_48);
    }
    local_54 = 0;
    pDbPage->pgno = iFreePage;
    bVar4 = (byte)local_4c;
    if ((bVar4 & 0xfb) == 1) {
      iVar5 = setChildPtrmaps(pDbPage);
      if (iVar5 != 0) {
        return iVar5;
      }
      if (bVar4 == 1) {
        return 0;
      }
    }
    else {
      uVar7 = *(uint *)pDbPage->aData;
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      if ((uVar7 != 0) && (ptrmapPut(local_40,uVar7,'\x04',iFreePage,&local_54), local_54 != 0)) {
        return local_54;
      }
    }
    iVar5 = btreeGetPage(local_40,local_50,&local_48,0);
    if (iVar5 == 0) {
      iVar5 = sqlite3PagerWrite(local_48->pDbPage);
      if (iVar5 == 0) {
        eType_00 = (u8)local_4c;
        iVar5 = modifyPagePointer(local_48,iFrom,iFreePage,(u8)local_4c);
        local_54 = iVar5;
        sqlite3PagerUnrefNotNull(local_48->pDbPage);
        if (iVar5 == 0) {
          ptrmapPut(local_40,iFreePage,eType_00,local_50,&local_54);
          iVar5 = local_54;
        }
      }
      else {
        sqlite3PagerUnrefNotNull(local_48->pDbPage);
      }
    }
  }
  return iVar5;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 || 
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %d to free page %d (ptr page %d type %d)\n", 
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}